

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O0

bool __thiscall irr::scene::CB3DMeshFileLoader::readChunkBRUS(CB3DMeshFileLoader *this)

{
  uint uVar1;
  u32 uVar2;
  uint *puVar3;
  SB3dChunk *pSVar4;
  long lVar5;
  SColorf *this_00;
  SB3dTexture *pSVar6;
  CB3DMeshFileLoader *this_01;
  long in_RDI;
  double __x;
  u32 j;
  SB3dTexture *TmpTexture;
  s32 texture_id_1;
  s32 texture_id;
  u32 i;
  SB3dMaterial *B3dMaterial;
  string name;
  u32 n_texs_offset;
  u32 num_textures;
  u32 n_texs;
  SB3dMaterial *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe80;
  SColor local_16c;
  SColorf local_168;
  u32 local_158;
  uint local_154;
  SB3dTexture *local_150;
  int local_144;
  uint local_140;
  uint local_13c;
  SB3dMaterial *local_138;
  string local_38 [36];
  uint local_14;
  uint local_10;
  uint local_c [3];
  
  (**(code **)**(undefined8 **)(in_RDI + 0xd0))(*(undefined8 **)(in_RDI + 0xd0),local_c,4);
  puVar3 = core::min_<unsigned_int>(local_c,&video::MATERIAL_MAX_TEXTURES);
  local_10 = *puVar3;
  if (local_10 < local_c[0]) {
    uVar1 = local_c[0] - local_10;
    local_14 = uVar1;
  }
  else {
    uVar1 = 0;
    local_14 = uVar1;
  }
  while( true ) {
    pSVar4 = core::array<irr::scene::SB3dChunk>::getLast((array<irr::scene::SB3dChunk> *)0x2cd777);
    lVar5 = pSVar4->startposition;
    pSVar4 = core::array<irr::scene::SB3dChunk>::getLast((array<irr::scene::SB3dChunk> *)0x2cd78e);
    this_01 = (CB3DMeshFileLoader *)(lVar5 + pSVar4->length);
    lVar5 = (**(code **)(**(long **)(in_RDI + 0xd0) + 0x18))();
    if ((long)this_01 <= lVar5) break;
    readString_abi_cxx11_(this_01);
    this_00 = (SColorf *)(in_RDI + 0x28);
    SB3dMaterial::SB3dMaterial
              ((SB3dMaterial *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    core::array<irr::scene::SB3dMaterial>::push_back
              ((array<irr::scene::SB3dMaterial> *)
               CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    SB3dMaterial::~SB3dMaterial((SB3dMaterial *)0x2cd808);
    local_138 = core::array<irr::scene::SB3dMaterial>::getLast
                          ((array<irr::scene::SB3dMaterial> *)0x2cd816);
    readFloats((CB3DMeshFileLoader *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (f32 *)in_stack_fffffffffffffe58,0);
    readFloats((CB3DMeshFileLoader *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (f32 *)in_stack_fffffffffffffe58,0);
    readFloats((CB3DMeshFileLoader *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (f32 *)in_stack_fffffffffffffe58,0);
    readFloats((CB3DMeshFileLoader *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (f32 *)in_stack_fffffffffffffe58,0);
    readFloats((CB3DMeshFileLoader *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (f32 *)in_stack_fffffffffffffe58,0);
    (**(code **)**(undefined8 **)(in_RDI + 0xd0))
              (*(undefined8 **)(in_RDI + 0xd0),&local_138->blend,4);
    (**(code **)**(undefined8 **)(in_RDI + 0xd0))(*(undefined8 **)(in_RDI + 0xd0),&local_138->fx,4);
    for (local_13c = 0; local_13c < local_10; local_13c = local_13c + 1) {
      local_140 = 0xffffffff;
      (**(code **)**(undefined8 **)(in_RDI + 0xd0))(*(undefined8 **)(in_RDI + 0xd0),&local_140,4);
      in_stack_fffffffffffffe64 = local_140;
      uVar2 = core::array<irr::scene::SB3dTexture>::size((array<irr::scene::SB3dTexture> *)0x2cd938)
      ;
      if (in_stack_fffffffffffffe64 < uVar2) {
        pSVar6 = core::array<irr::scene::SB3dTexture>::operator[]
                           ((array<irr::scene::SB3dTexture> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            (u32)((ulong)in_stack_fffffffffffffe58 >> 0x20));
        local_138->Textures[local_13c] = pSVar6;
      }
      else {
        local_138->Textures[local_13c] = (SB3dTexture *)0x0;
      }
    }
    for (local_13c = 0; local_13c < local_14; local_13c = local_13c + 1) {
      local_144 = -1;
      (**(code **)**(undefined8 **)(in_RDI + 0xd0))(*(undefined8 **)(in_RDI + 0xd0),&local_144,4);
      if ((((*(byte *)(in_RDI + 0xde) & 1) != 0) && (local_144 != -1)) && (4 < local_c[0])) {
        __x = (double)(**(code **)(**(long **)(in_RDI + 0xd0) + 0x20))();
        os::Printer::log(__x);
        *(undefined1 *)(in_RDI + 0xde) = 0;
      }
    }
    if ((local_138->Textures[0] != (SB3dTexture *)0x0) &&
       ((local_138->Textures[0]->Flags & 0x10000U) != 0)) {
      local_150 = local_138->Textures[1];
      local_138->Textures[1] = local_138->Textures[0];
      local_138->Textures[0] = local_150;
    }
    for (local_13c = local_10; local_13c != 0; local_13c = local_13c - 1) {
      for (local_154 = local_13c - 1; local_154 < local_10 - 1; local_154 = local_154 + 1) {
        if ((local_138->Textures[local_154 + 1] != (SB3dTexture *)0x0) &&
           (local_138->Textures[local_154] == (SB3dTexture *)0x0)) {
          local_138->Textures[local_154] = local_138->Textures[local_154 + 1];
          local_138->Textures[local_154 + 1] = (SB3dTexture *)0x0;
        }
      }
    }
    if (local_138->Textures[1] == (SB3dTexture *)0x0) {
      if (local_138->Textures[0] == (SB3dTexture *)0x0) {
        if (((float)local_138->alpha != 1.0) || (NAN((float)local_138->alpha))) {
          (local_138->Material).MaterialType = EMT_TRANSPARENT_VERTEX_ALPHA;
          *(ushort *)&(local_138->Material).field_0xb0 =
               *(ushort *)&(local_138->Material).field_0xb0 & 0xffcf;
        }
        else {
          (local_138->Material).MaterialType = EMT_SOLID;
        }
      }
      else if ((local_138->Textures[0]->Flags & 2U) == 0) {
        if ((local_138->Textures[0]->Flags & 4U) == 0) {
          if (((float)local_138->alpha != 1.0) || (NAN((float)local_138->alpha))) {
            (local_138->Material).MaterialType = EMT_TRANSPARENT_VERTEX_ALPHA;
            *(ushort *)&(local_138->Material).field_0xb0 =
                 *(ushort *)&(local_138->Material).field_0xb0 & 0xffcf;
          }
          else {
            (local_138->Material).MaterialType = EMT_SOLID;
          }
        }
        else {
          (local_138->Material).MaterialType = EMT_TRANSPARENT_ALPHA_CHANNEL_REF;
        }
      }
      else {
        (local_138->Material).MaterialType = EMT_TRANSPARENT_ALPHA_CHANNEL;
        *(ushort *)&(local_138->Material).field_0xb0 =
             *(ushort *)&(local_138->Material).field_0xb0 & 0xffcf;
      }
    }
    else {
      (local_138->Material).MaterialType = EMT_TRANSPARENT_VERTEX_ALPHA;
      *(ushort *)&(local_138->Material).field_0xb0 =
           *(ushort *)&(local_138->Material).field_0xb0 & 0xffcf;
    }
    video::SColorf::SColorf
              (&local_168,local_138->red,local_138->green,local_138->blue,local_138->alpha);
    local_158 = (u32)video::SColorf::toSColor(this_00);
    (local_138->Material).DiffuseColor.color = local_158;
    *(ushort *)&(local_138->Material).field_0xa2 =
         *(ushort *)&(local_138->Material).field_0xa2 & 0xff8f;
    if ((local_138->fx & 1U) == 0) {
      (local_138->Material).AmbientColor.color = (local_138->Material).DiffuseColor.color;
    }
    else {
      video::SColor::SColor(&local_16c,0xff,0xff,0xff,0xff);
      (local_138->Material).AmbientColor.color = local_16c.color;
      *(ushort *)&(local_138->Material).field_0xb0 =
           *(ushort *)&(local_138->Material).field_0xb0 & 0xfff7;
    }
    if ((local_138->fx & 2U) != 0) {
      *(ushort *)&(local_138->Material).field_0xa2 =
           *(ushort *)&(local_138->Material).field_0xa2 & 0xff8f | 0x50;
    }
    if ((local_138->fx & 4U) != 0) {
      *(ushort *)&(local_138->Material).field_0xb0 =
           *(ushort *)&(local_138->Material).field_0xb0 & 0xfffb;
    }
    if ((local_138->fx & 0x10U) != 0) {
      *(ushort *)&(local_138->Material).field_0xb0 =
           *(ushort *)&(local_138->Material).field_0xb0 & 0xffbf;
    }
    if ((local_138->fx & 0x20U) != 0) {
      (local_138->Material).MaterialType = EMT_TRANSPARENT_VERTEX_ALPHA;
      *(ushort *)&(local_138->Material).field_0xb0 =
           *(ushort *)&(local_138->Material).field_0xb0 & 0xffcf;
    }
    (local_138->Material).Shininess = local_138->shininess;
    ::std::__cxx11::string::~string(local_38);
  }
  core::array<irr::scene::SB3dChunk>::size((array<irr::scene::SB3dChunk> *)0x2cdec4);
  core::array<irr::scene::SB3dChunk>::erase
            ((array<irr::scene::SB3dChunk> *)CONCAT44(uVar1,in_stack_fffffffffffffe80),
             (u32)((ulong)this_01 >> 0x20));
  return true;
}

Assistant:

bool CB3DMeshFileLoader::readChunkBRUS()
{
#ifdef _B3D_READER_DEBUG
	core::stringc logStr;
	for (u32 i = 1; i < B3dStack.size(); ++i)
		logStr += "-";
	logStr += "read ChunkBRUS";
	os::Printer::log(logStr.c_str(), ELL_DEBUG);
#endif

	u32 n_texs;
	B3DFile->read(&n_texs, sizeof(u32));
#ifdef __BIG_ENDIAN__
	n_texs = os::Byteswap::byteswap(n_texs);
#endif

	// number of texture ids read for Irrlicht
	const u32 num_textures = core::min_(n_texs, video::MATERIAL_MAX_TEXTURES);
	// number of bytes to skip (for ignored texture ids)
	const u32 n_texs_offset = (num_textures < n_texs) ? (n_texs - num_textures) : 0;

	while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) // this chunk repeats
	{
		// This is what blitz basic calls a brush, like a Irrlicht Material

		auto name = readString();
#ifdef _B3D_READER_DEBUG
		os::Printer::log("read Material", name.c_str(), ELL_DEBUG);
#endif
		Materials.push_back(SB3dMaterial());
		SB3dMaterial &B3dMaterial = Materials.getLast();

		readFloats(&B3dMaterial.red, 1);
		readFloats(&B3dMaterial.green, 1);
		readFloats(&B3dMaterial.blue, 1);
		readFloats(&B3dMaterial.alpha, 1);
		readFloats(&B3dMaterial.shininess, 1);

		B3DFile->read(&B3dMaterial.blend, sizeof(B3dMaterial.blend));
		B3DFile->read(&B3dMaterial.fx, sizeof(B3dMaterial.fx));
#ifdef __BIG_ENDIAN__
		B3dMaterial.blend = os::Byteswap::byteswap(B3dMaterial.blend);
		B3dMaterial.fx = os::Byteswap::byteswap(B3dMaterial.fx);
#endif
#ifdef _B3D_READER_DEBUG
		os::Printer::log("Blend", core::stringc(B3dMaterial.blend).c_str(), ELL_DEBUG);
		os::Printer::log("FX", core::stringc(B3dMaterial.fx).c_str(), ELL_DEBUG);
#endif

		u32 i;
		for (i = 0; i < num_textures; ++i) {
			s32 texture_id = -1;
			B3DFile->read(&texture_id, sizeof(s32));
#ifdef __BIG_ENDIAN__
			texture_id = os::Byteswap::byteswap(texture_id);
#endif
			//--- Get pointers to the texture, based on the IDs ---
			if ((u32)texture_id < Textures.size()) {
				B3dMaterial.Textures[i] = &Textures[texture_id];
#ifdef _B3D_READER_DEBUG
				os::Printer::log("Layer", core::stringc(i).c_str(), ELL_DEBUG);
				os::Printer::log("using texture", Textures[texture_id].TextureName.c_str(), ELL_DEBUG);
#endif
			} else
				B3dMaterial.Textures[i] = 0;
		}
		// skip other texture ids
		for (i = 0; i < n_texs_offset; ++i) {
			s32 texture_id = -1;
			B3DFile->read(&texture_id, sizeof(s32));
#ifdef __BIG_ENDIAN__
			texture_id = os::Byteswap::byteswap(texture_id);
#endif
			if (ShowWarning && (texture_id != -1) && (n_texs > video::MATERIAL_MAX_TEXTURES)) {
				os::Printer::log("Too many textures used in one material", B3DFile->getFileName(), ELL_WARNING);
				ShowWarning = false;
			}
		}

		// Fixes problems when the lightmap is on the first texture:
		if (B3dMaterial.Textures[0] != 0) {
			if (B3dMaterial.Textures[0]->Flags & 65536) { // 65536 = secondary UV
				SB3dTexture *TmpTexture;
				TmpTexture = B3dMaterial.Textures[1];
				B3dMaterial.Textures[1] = B3dMaterial.Textures[0];
				B3dMaterial.Textures[0] = TmpTexture;
			}
		}

		// If a preceeding texture slot is empty move the others down:
		for (i = num_textures; i > 0; --i) {
			for (u32 j = i - 1; j < num_textures - 1; ++j) {
				if (B3dMaterial.Textures[j + 1] != 0 && B3dMaterial.Textures[j] == 0) {
					B3dMaterial.Textures[j] = B3dMaterial.Textures[j + 1];
					B3dMaterial.Textures[j + 1] = 0;
				}
			}
		}

		//------ Convert blitz flags/blend to irrlicht -------

		// Two textures:
		if (B3dMaterial.Textures[1]) {
			B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
			B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
		} else if (B3dMaterial.Textures[0]) { // One texture:
			// Flags & 0x1 is usual SOLID, 0x8 is mipmap (handled before)
			if (B3dMaterial.Textures[0]->Flags & 0x2) { // (Alpha mapped)
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_ALPHA_CHANNEL;
				B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
			} else if (B3dMaterial.Textures[0]->Flags & 0x4)                                  //(Masked)
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_ALPHA_CHANNEL_REF; // TODO: create color key texture
			else if (B3dMaterial.alpha == 1.f)
				B3dMaterial.Material.MaterialType = video::EMT_SOLID;
			else {
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
				B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
			}
		} else // No texture:
		{
			if (B3dMaterial.alpha == 1.f)
				B3dMaterial.Material.MaterialType = video::EMT_SOLID;
			else {
				B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
				B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
			}
		}

		B3dMaterial.Material.DiffuseColor = video::SColorf(B3dMaterial.red, B3dMaterial.green, B3dMaterial.blue, B3dMaterial.alpha).toSColor();
		B3dMaterial.Material.ColorMaterial = video::ECM_NONE;

		//------ Material fx ------

		if (B3dMaterial.fx & 1) { // full-bright
			B3dMaterial.Material.AmbientColor = video::SColor(255, 255, 255, 255);
			B3dMaterial.Material.Lighting = false;
		} else
			B3dMaterial.Material.AmbientColor = B3dMaterial.Material.DiffuseColor;

		if (B3dMaterial.fx & 2) // use vertex colors instead of brush color
			B3dMaterial.Material.ColorMaterial = video::ECM_DIFFUSE_AND_AMBIENT;

		if (B3dMaterial.fx & 4) // flatshaded
			B3dMaterial.Material.GouraudShading = false;

		if (B3dMaterial.fx & 16) // disable backface culling
			B3dMaterial.Material.BackfaceCulling = false;

		if (B3dMaterial.fx & 32) { // force vertex alpha-blending
			B3dMaterial.Material.MaterialType = video::EMT_TRANSPARENT_VERTEX_ALPHA;
			B3dMaterial.Material.ZWriteEnable = video::EZW_OFF;
		}

		B3dMaterial.Material.Shininess = B3dMaterial.shininess;
	}

	B3dStack.erase(B3dStack.size() - 1);

	return true;
}